

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O0

bool VerifyCharacterVector
               (Verifier *verifier,Vector<flatbuffers::Offset<void>,_unsigned_int> *values,
               Vector<unsigned_char,_unsigned_int> *types)

{
  Character type;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  return_type obj;
  uint local_2c;
  uoffset_t i;
  Vector<unsigned_char,_unsigned_int> *types_local;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *values_local;
  Verifier *verifier_local;
  
  if ((values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0) ||
     (types == (Vector<unsigned_char,_unsigned_int> *)0x0)) {
    verifier_local._7_1_ =
         values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 &&
         types == (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else {
    uVar2 = flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>::size(values);
    uVar3 = flatbuffers::Vector<unsigned_char,_unsigned_int>::size(types);
    if (uVar2 == uVar3) {
      for (local_2c = 0;
          uVar2 = flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>::size(values),
          local_2c < uVar2; local_2c = local_2c + 1) {
        obj = flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>::Get(values,local_2c);
        type = flatbuffers::Vector<unsigned_char,_unsigned_int>::GetEnum<Character>(types,local_2c);
        bVar1 = VerifyCharacter(verifier,obj,type);
        if (!bVar1) {
          return false;
        }
      }
      verifier_local._7_1_ = true;
    }
    else {
      verifier_local._7_1_ = false;
    }
  }
  return verifier_local._7_1_;
}

Assistant:

inline bool VerifyCharacterVector(::flatbuffers::Verifier &verifier, const ::flatbuffers::Vector<::flatbuffers::Offset<void>> *values, const ::flatbuffers::Vector<uint8_t> *types) {
  if (!values || !types) return !values && !types;
  if (values->size() != types->size()) return false;
  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {
    if (!VerifyCharacter(
        verifier,  values->Get(i), types->GetEnum<Character>(i))) {
      return false;
    }
  }
  return true;
}